

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O3

void __thiscall FWadFile::FindStrifeTeaserVoices(FWadFile *this)

{
  DWORD DVar1;
  FWadFileLump *pFVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  
  DVar1 = (this->super_FResourceFile).NumLumps;
  pFVar2 = this->Lumps;
  pcVar3 = (pFVar2->super_FResourceLump).field_3.Name + 3;
  uVar4 = 0;
  do {
    if (((pFVar2[uVar4].super_FResourceLump.field_3.Name[0] == 'V') &&
        (pFVar2[uVar4].super_FResourceLump.field_3.Name[1] == 'O')) &&
       (pFVar2[uVar4].super_FResourceLump.field_3.Name[2] == 'C')) {
      lVar5 = 0;
      do {
        if (9 < (int)pcVar3[lVar5] - 0x30U && pcVar3[lVar5] != '\0') goto LAB_004d3c93;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 5);
      pFVar2[uVar4].super_FResourceLump.Namespace = 9;
    }
LAB_004d3c93:
    uVar4 = uVar4 + 1;
    pcVar3 = pcVar3 + 0x58;
    if (uVar4 == DVar1 + 1 + (uint)(DVar1 == 0xffffffff)) {
      return;
    }
  } while( true );
}

Assistant:

void FWadFile::FindStrifeTeaserVoices ()
{
	for (DWORD i = 0; i <= NumLumps; ++i)
	{
		if (Lumps[i].Name[0] == 'V' &&
			Lumps[i].Name[1] == 'O' &&
			Lumps[i].Name[2] == 'C')
		{
			int j;

			for (j = 3; j < 8; ++j)
			{
				if (Lumps[i].Name[j] != 0 && !isdigit(Lumps[i].Name[j]))
					break;
			}
			if (j == 8)
			{
				Lumps[i].Namespace = ns_strifevoices;
			}
		}
	}
}